

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

const_iterator
frozen::
unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,1ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
::
find_impl<frozen::unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,1ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>const&,std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
          (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_1UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *self,basic_string_view<char,_std::char_traits<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
          equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  bool bVar1;
  size_t sVar2;
  const_iterator pvVar3;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_1UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *puVar4;
  const_iterator it;
  size_t pos;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal_local;
  elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash_local;
  basic_string_view<char,_std::char_traits<char>_> *key_local;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_1UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *self_local;
  
  sVar2 = bits::pmh_tables<2ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
          lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<2ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&self->tables_,key,hash);
  pvVar3 = bits::
           carray<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_1UL>
           ::begin(&self->items_);
  self_local = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_1UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)(pvVar3 + sVar2);
  puVar4 = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_1UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)bits::
              carray<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_1UL>
              ::end(&self->items_);
  if ((self_local == puVar4) ||
     (bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        (equal,(basic_string_view<char,_std::char_traits<char>_> *)self_local,key),
     !bVar1)) {
    self_local = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_1UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)bits::
                    carray<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_1UL>
                    ::end(&self->items_);
  }
  return (const_iterator)self_local;
}

Assistant:

static inline constexpr auto find_impl(This&& self, KeyType const &key, Hasher const &hash, Equal const &equal) {
    auto const pos = self.tables_.lookup(key, hash);
    auto it = self.items_.begin() + pos;
    if (it != self.items_.end() && equal(it->first, key))
      return it;
    else
      return self.items_.end();
  }